

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetRelErrFunc(void *kinmem,realtype relfunc)

{
  double local_40;
  double local_38;
  realtype uround;
  KINMem kin_mem;
  realtype relfunc_local;
  void *kinmem_local;
  
  if (kinmem == (void *)0x0) {
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINSetRelErrFunc","kinsol_mem = NULL illegal.");
    kinmem_local._4_4_ = -1;
  }
  else if (0.0 <= relfunc) {
    if ((relfunc != 0.0) || (NAN(relfunc))) {
      if (0.0 < relfunc) {
        local_40 = sqrt(relfunc);
      }
      else {
        local_40 = 0.0;
      }
      *(double *)((long)kinmem + 0x80) = local_40;
    }
    else {
      if (0.0 < *kinmem) {
        local_38 = sqrt(*kinmem);
      }
      else {
        local_38 = 0.0;
      }
      *(double *)((long)kinmem + 0x80) = local_38;
    }
    kinmem_local._4_4_ = 0;
  }
  else {
    KINProcessError((KINMem)0x0,-2,"KINSOL","KINSetRelErrFunc","relfunc < 0 illegal.");
    kinmem_local._4_4_ = -2;
  }
  return kinmem_local._4_4_;
}

Assistant:

int KINSetRelErrFunc(void *kinmem, realtype relfunc)
{
  KINMem kin_mem;
  realtype uround;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINSetRelErrFunc", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;

  if (relfunc < ZERO) {
    KINProcessError(NULL, KIN_ILL_INPUT, "KINSOL", "KINSetRelErrFunc", MSG_BAD_RELFUNC);
    return(KIN_ILL_INPUT);
  }

  if (relfunc == ZERO) {
    uround = kin_mem->kin_uround;
    kin_mem->kin_sqrt_relfunc = SUNRsqrt(uround);
  } else {
    kin_mem->kin_sqrt_relfunc = SUNRsqrt(relfunc);
  }

  return(KIN_SUCCESS);
}